

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_type.cpp
# Opt level: O3

bool __thiscall pstore::brokerface::message_type::operator==(message_type *this,message_type *rhs)

{
  int iVar1;
  
  if ((((this->sender_id == rhs->sender_id) && (this->message_id == rhs->message_id)) &&
      (this->part_no == rhs->part_no)) && (this->num_parts == rhs->num_parts)) {
    iVar1 = bcmp(&this->payload,&rhs->payload,0xf4);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool message_type::operator== (message_type const & rhs) const {
            return sender_id == rhs.sender_id && message_id == rhs.message_id &&
                   part_no == rhs.part_no && num_parts == rhs.num_parts && payload == rhs.payload;
        }